

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<short,short>::
Update<duckdb::BitpackingCompressionState<short,true,short>::BitpackingWriter>
          (BitpackingState<short,short> *this,short value,bool is_valid)

{
  long lVar1;
  bool bVar2;
  short sVar3;
  
  lVar1 = *(long *)(this + 0x2810);
  this[lVar1 + 0x2010] = (BitpackingState<short,short>)is_valid;
  this[0x2836] = (BitpackingState<short,short>)((byte)this[0x2836] & is_valid);
  this[0x2837] = (BitpackingState<short,short>)((byte)this[0x2837] & !is_valid);
  if (is_valid) {
    *(short *)(*(long *)(this + 0x1008) + lVar1 * 2) = value;
    sVar3 = (short)*(undefined4 *)(this + 0x2828);
    if (value <= (short)*(undefined4 *)(this + 0x2828)) {
      sVar3 = value;
    }
    *(short *)(this + 0x2828) = sVar3;
    sVar3 = *(short *)(this + 0x282a);
    if (*(short *)(this + 0x282a) <= value) {
      sVar3 = value;
    }
    *(short *)(this + 0x282a) = sVar3;
  }
  *(long *)(this + 0x2810) = lVar1 + 1;
  if (lVar1 + 1 == 0x800) {
    bVar2 = Flush<duckdb::BitpackingCompressionState<short,true,short>::BitpackingWriter>(this);
    *(undefined2 *)(this + 0x2828) = 0x7fff;
    *(undefined2 *)(this + 0x282e) = 0x7fff;
    *(undefined4 *)(this + 0x282a) = 0x8000;
    *(undefined4 *)(this + 0x2830) = 0x8000;
    *(undefined2 *)(this + 0x2834) = 0;
    *(undefined4 *)(this + 0x2836) = 0x101;
    *(undefined8 *)(this + 0x2810) = 0;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}